

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQBool sqstd_rex_matchcclass(SQInteger cclass,SQChar c)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  switch(cclass) {
  case 0x6c:
    iVar1 = islower((int)c);
    break;
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
    goto switchD_001086cf_caseD_51;
  case 0x70:
    iVar1 = ispunct((int)c);
    break;
  case 0x73:
    iVar1 = isspace((int)c);
    break;
  case 0x75:
    iVar1 = isupper((int)c);
    break;
  case 0x77:
    iVar1 = isalnum((int)c);
    bVar2 = c == '_' || iVar1 != 0;
    goto switchD_001086cf_caseD_51;
  case 0x78:
    iVar1 = isxdigit((int)c);
    break;
  default:
    switch(cclass) {
    case 0x50:
      iVar1 = ispunct((int)c);
      break;
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
    case 0x56:
      goto switchD_001086cf_caseD_51;
    case 0x53:
      iVar1 = isspace((int)c);
      break;
    case 0x57:
      iVar1 = isalnum((int)c);
      bVar2 = c != '_' && iVar1 == 0;
      goto switchD_001086cf_caseD_51;
    case 0x58:
      iVar1 = isxdigit((int)c);
      break;
    default:
      if (cclass == 0x41) {
        iVar1 = isalpha((int)c);
      }
      else {
        if (cclass != 0x43) {
          if (cclass == 0x44) {
            bVar2 = (int)c - 0x3aU < 0xfffffff6;
            goto switchD_001086cf_caseD_51;
          }
          if (cclass == 100) {
            bVar2 = (int)c - 0x30U < 10;
            goto switchD_001086cf_caseD_51;
          }
          if (cclass == 99) {
            iVar1 = iscntrl((int)c);
          }
          else {
            bVar2 = false;
            if (cclass != 0x61) goto switchD_001086cf_caseD_51;
            iVar1 = isalpha((int)c);
          }
          goto LAB_0010875b;
        }
        iVar1 = iscntrl((int)c);
      }
    }
    bVar2 = iVar1 == 0;
    goto switchD_001086cf_caseD_51;
  }
LAB_0010875b:
  bVar2 = iVar1 != 0;
switchD_001086cf_caseD_51:
  return (ulong)bVar2;
}

Assistant:

static SQBool sqstd_rex_matchcclass(SQInteger cclass,SQChar c)
{
    switch(cclass) {
    case 'a': return isalpha(c)?SQTrue:SQFalse;
    case 'A': return !isalpha(c)?SQTrue:SQFalse;
    case 'w': return (isalnum(c) || c == '_')?SQTrue:SQFalse;
    case 'W': return (!isalnum(c) && c != '_')?SQTrue:SQFalse;
    case 's': return isspace(c)?SQTrue:SQFalse;
    case 'S': return !isspace(c)?SQTrue:SQFalse;
    case 'd': return isdigit(c)?SQTrue:SQFalse;
    case 'D': return !isdigit(c)?SQTrue:SQFalse;
    case 'x': return isxdigit(c)?SQTrue:SQFalse;
    case 'X': return !isxdigit(c)?SQTrue:SQFalse;
    case 'c': return iscntrl(c)?SQTrue:SQFalse;
    case 'C': return !iscntrl(c)?SQTrue:SQFalse;
    case 'p': return ispunct(c)?SQTrue:SQFalse;
    case 'P': return !ispunct(c)?SQTrue:SQFalse;
    case 'l': return islower(c)?SQTrue:SQFalse;
    case 'u': return isupper(c)?SQTrue:SQFalse;
    }
    return SQFalse; /*cannot happen*/
}